

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus
ZydisCollectOptionalPrefixes(ZydisDecoderState *state,ZydisDecodedInstruction *instruction)

{
  byte bVar1;
  ZyanStatus ZVar2;
  byte local_24;
  char local_23;
  ZyanU8 local_22;
  byte local_21;
  ZyanStatus status_047620348;
  ZyanU8 prefix_byte;
  ZyanBool done;
  ZyanU8 offset;
  ZyanU8 rex;
  ZydisDecodedInstruction *instruction_local;
  ZydisDecoderState *state_local;
  
  _status_047620348 = instruction;
  instruction_local = (ZydisDecodedInstruction *)state;
  if (state == (ZydisDecoderState *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xc0f,
                  "ZyanStatus ZydisCollectOptionalPrefixes(ZydisDecoderState *, ZydisDecodedInstruction *)"
                 );
  }
  if (instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xc10,
                  "ZyanStatus ZydisCollectOptionalPrefixes(ZydisDecoderState *, ZydisDecodedInstruction *)"
                 );
  }
  if ((instruction->raw).prefix_count != '\0') {
    __assert_fail("instruction->raw.prefix_count == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xc11,
                  "ZyanStatus ZydisCollectOptionalPrefixes(ZydisDecoderState *, ZydisDecodedInstruction *)"
                 );
  }
  local_21 = 0;
  local_22 = '\0';
  local_23 = '\0';
  do {
    ZVar2 = ZydisInputPeek((ZydisDecoderState *)instruction_local,_status_047620348,&local_24);
    if ((ZVar2 & 0x80000000) != 0) {
      return ZVar2;
    }
    if ((((local_24 == 0x26) || (local_24 == 0x2e)) || (local_24 == 0x36)) || (local_24 == 0x3e)) {
      if (**(int **)instruction_local != 0) goto LAB_0010efa7;
      if (((local_24 == 0x3e) && (*(char *)((long)&instruction_local->attributes + 3) != 'd')) &&
         (*(char *)((long)&instruction_local->attributes + 3) != 'e')) {
        *(ZyanU8 *)((long)&instruction_local->cpu_flags + 4) = local_22;
      }
      *(byte *)((long)&instruction_local->attributes + 2) = local_24;
      *(ZyanU8 *)((long)&instruction_local->attributes + 7) = local_22;
    }
    else if ((local_24 == 100) || (local_24 == 0x65)) {
LAB_0010efa7:
      *(byte *)((long)&instruction_local->attributes + 2) = local_24;
      *(ZyanU8 *)((long)&instruction_local->attributes + 7) = local_22;
      *(byte *)((long)&instruction_local->attributes + 3) = local_24;
      *(ZyanU8 *)((long)&instruction_local->cpu_flags + 2) = local_22;
      *(undefined1 *)((long)&instruction_local->cpu_flags + 4) = 0xff;
    }
    else if (local_24 == 0x66) {
      *(ZyanU8 *)&instruction_local->cpu_flags = local_22;
      if (*(char *)((long)&instruction_local->attributes + 4) == '\0') {
        *(undefined1 *)((long)&instruction_local->attributes + 4) = 0x66;
        *(ZyanU8 *)((long)&instruction_local->cpu_flags + 3) = local_22;
      }
      _status_047620348->attributes = _status_047620348->attributes | 0x80000000000;
    }
    else if (local_24 == 0x67) {
      *(ZyanU8 *)((long)&instruction_local->cpu_flags + 1) = local_22;
      _status_047620348->attributes = _status_047620348->attributes | 0x100000000000;
    }
    else if (local_24 == 0xf0) {
      *(undefined1 *)&instruction_local->attributes = 1;
      *(ZyanU8 *)((long)&instruction_local->attributes + 5) = local_22;
    }
    else if ((local_24 == 0xf2) || (local_24 == 0xf3)) {
      *(byte *)((long)&instruction_local->attributes + 1) = local_24;
      *(byte *)((long)&instruction_local->attributes + 4) = local_24;
      *(ZyanU8 *)((long)&instruction_local->attributes + 6) = local_22;
      *(ZyanU8 *)((long)&instruction_local->cpu_flags + 3) = local_22;
    }
    else if ((**(int **)instruction_local == 0) && ((local_24 & 0xf0) == 0x40)) {
      local_21 = local_24;
      (_status_047620348->raw).field_3.rex.offset = local_22;
    }
    else {
      local_23 = '\x01';
    }
    if (local_23 == '\0') {
      if ((local_21 != 0) && (local_21 != local_24)) {
        local_21 = 0;
        (_status_047620348->raw).field_3.rex.offset = '\0';
      }
      bVar1 = (_status_047620348->raw).prefix_count;
      (_status_047620348->raw).prefix_count = bVar1 + 1;
      (_status_047620348->raw).prefixes[bVar1].value = local_24;
      ZydisInputSkip((ZydisDecoderState *)instruction_local,_status_047620348);
      local_22 = local_22 + '\x01';
    }
    if (local_23 != '\0') {
      if ((_status_047620348->attributes & 0x80000000000) != 0) {
        (_status_047620348->raw).prefixes[*(byte *)&instruction_local->cpu_flags].type =
             ZYDIS_PREFIX_TYPE_EFFECTIVE;
      }
      if ((_status_047620348->attributes & 0x100000000000) != 0) {
        (_status_047620348->raw).prefixes[*(byte *)((long)&instruction_local->cpu_flags + 1)].type =
             ZYDIS_PREFIX_TYPE_EFFECTIVE;
      }
      if (local_21 != 0) {
        (_status_047620348->raw).prefixes[(_status_047620348->raw).field_3.rex.offset].type =
             ZYDIS_PREFIX_TYPE_EFFECTIVE;
        ZydisDecodeREX(*(ZydisDecoderContext **)&instruction_local->length,_status_047620348,
                       local_21);
      }
      if ((**(int **)instruction_local != 0) &&
         (*(char *)((long)&instruction_local->attributes + 2) == '>')) {
        *(undefined1 *)((long)&instruction_local->cpu_flags + 4) =
             *(undefined1 *)((long)&instruction_local->attributes + 7);
      }
      return 0x100000;
    }
  } while( true );
}

Assistant:

static ZyanStatus ZydisCollectOptionalPrefixes(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(instruction->raw.prefix_count == 0);

    ZyanU8 rex = 0x00;
    ZyanU8 offset = 0;
    ZyanBool done = ZYAN_FALSE;
    do
    {
        ZyanU8 prefix_byte;
        ZYAN_CHECK(ZydisInputPeek(state, instruction, &prefix_byte));
        switch (prefix_byte)
        {
        case 0xF0:
            state->prefixes.has_lock = ZYAN_TRUE;
            state->prefixes.offset_lock = offset;
            break;
        case 0xF2:
            ZYAN_FALLTHROUGH;
        case 0xF3:
            state->prefixes.group1 = prefix_byte;
            state->prefixes.mandatory_candidate = prefix_byte;
            state->prefixes.offset_group1 = offset;
            state->prefixes.offset_mandatory = offset;
            break;
        case 0x2E:
            ZYAN_FALLTHROUGH;
        case 0x36:
            ZYAN_FALLTHROUGH;
        case 0x3E:
            ZYAN_FALLTHROUGH;
        case 0x26:
            if (state->decoder->machine_mode == ZYDIS_MACHINE_MODE_LONG_64)
            {
                if ((prefix_byte == 0x3E) &&
                    (state->prefixes.effective_segment != 0x64) &&
                    (state->prefixes.effective_segment != 0x65))
                {
                    state->prefixes.offset_notrack = offset;
                }
                state->prefixes.group2 = prefix_byte;
                state->prefixes.offset_group2 = offset;
                break;
            }
            ZYAN_FALLTHROUGH;
        case 0x64:
            ZYAN_FALLTHROUGH;
        case 0x65:
            state->prefixes.group2 = prefix_byte;
            state->prefixes.offset_group2 = offset;
            state->prefixes.effective_segment = prefix_byte;
            state->prefixes.offset_segment = offset;
            state->prefixes.offset_notrack = -1;
            break;
        case 0x66:
            // context->prefixes.has_osz_override = ZYAN_TRUE;
            state->prefixes.offset_osz_override = offset;
            if (!state->prefixes.mandatory_candidate)
            {
                state->prefixes.mandatory_candidate = 0x66;
                state->prefixes.offset_mandatory = offset;
            }
            instruction->attributes |= ZYDIS_ATTRIB_HAS_OPERANDSIZE;
            break;
        case 0x67:
            // context->prefixes.has_asz_override = ZYAN_TRUE;
            state->prefixes.offset_asz_override = offset;
            instruction->attributes |= ZYDIS_ATTRIB_HAS_ADDRESSSIZE;
            break;
        default:
            if ((state->decoder->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) &&
                (prefix_byte & 0xF0) == 0x40)
            {
                rex = prefix_byte;
                instruction->raw.rex.offset = offset;
            } else
            {
                done = ZYAN_TRUE;
            }
            break;
        }
        if (!done)
        {
            // Invalidate `REX`, if it's not the last legacy prefix
            if (rex && (rex != prefix_byte))
            {
                rex = 0x00;
                instruction->raw.rex.offset = 0;
            }
            instruction->raw.prefixes[instruction->raw.prefix_count++].value = prefix_byte;
            ZydisInputSkip(state, instruction);
            ++offset;
        }
    } while (!done);

    if (instruction->attributes & ZYDIS_ATTRIB_HAS_OPERANDSIZE)
    {
        instruction->raw.prefixes[state->prefixes.offset_osz_override].type =
            ZYDIS_PREFIX_TYPE_EFFECTIVE;
    }
    if (instruction->attributes & ZYDIS_ATTRIB_HAS_ADDRESSSIZE)
    {
        instruction->raw.prefixes[state->prefixes.offset_asz_override].type =
            ZYDIS_PREFIX_TYPE_EFFECTIVE;
    }
    if (rex)
    {
        instruction->raw.prefixes[instruction->raw.rex.offset].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
        ZydisDecodeREX(state->context, instruction, rex);
    }
    if ((state->decoder->machine_mode != ZYDIS_MACHINE_MODE_LONG_64) &&
        (state->prefixes.group2 == 0x3E))
    {
        state->prefixes.offset_notrack = state->prefixes.offset_group2;
    }

    return ZYAN_STATUS_SUCCESS;
}